

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O2

bool __thiscall test_CESkyCoord::test_Convert2Icrs(test_CESkyCoord *this)

{
  CEDate *date;
  CESkyCoord *this_00;
  undefined1 uVar1;
  double dVar2;
  CESkyCoord obs2icrs;
  CESkyCoord ecl2icrs;
  CESkyCoord icrs2icrs;
  CESkyCoord gal2icrs;
  CESkyCoord cirs2icrs;
  allocator local_1e5;
  undefined4 local_1e4;
  CEDate local_1e0;
  CESkyCoord local_1a0;
  CEObserver local_170;
  CESkyCoord local_c0;
  CESkyCoord local_90;
  CESkyCoord local_60;
  
  date = &this->base_date_;
  CEObserver::CEObserver(&local_170);
  CESkyCoord::ConvertToICRS(&local_60,&this->base_cirs_,date,&local_170);
  CEObserver::~CEObserver(&local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_c0);
  this_00 = &this->base_icrs_;
  local_1e0._vptr_CEDate._0_4_ = 0xe4;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c0);
  CESkyCoord::CIRS2ICRS(&this->base_cirs_,&local_60,date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_c0);
  local_1e0._vptr_CEDate._0_4_ = 0xe7;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c0);
  dVar2 = CEDate::CurrentJD();
  CEDate::CEDate(&local_1e0,dVar2,JD);
  CEObserver::CEObserver(&local_170);
  CESkyCoord::ConvertToICRS(&local_c0,this_00,&local_1e0,&local_170);
  CEObserver::~CEObserver(&local_170);
  CEDate::~CEDate(&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_90);
  local_1e0._vptr_CEDate._0_4_ = 0xeb;
  (**(code **)(*(long *)this + 200))(this,&local_c0,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_90);
  dVar2 = CEDate::CurrentJD();
  CEDate::CEDate(&local_1e0,dVar2,JD);
  CEObserver::CEObserver(&local_170);
  CESkyCoord::ConvertToICRS(&local_90,&this->base_gal_,&local_1e0,&local_170);
  CEObserver::~CEObserver(&local_170);
  CEDate::~CEDate(&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_1a0);
  local_1e0._vptr_CEDate._0_4_ = 0xef;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  CESkyCoord::Galactic2ICRS(&this->base_gal_,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_1a0);
  local_1e0._vptr_CEDate._0_4_ = 0xf2;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a0);
  CESkyCoord::ConvertToICRS((CESkyCoord *)&local_1e0,&this->base_obs_,date,&this->base_observer_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_1e4);
  local_1a0._vptr_CESkyCoord._0_4_ = 0xf6;
  (**(code **)(*(long *)this + 200))(this,&local_1e0,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1e4);
  CESkyCoord::Observed2ICRS(&this->base_obs_,(CESkyCoord *)&local_1e0,date,&this->base_observer_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",(allocator *)&local_1e4);
  local_1a0._vptr_CESkyCoord._0_4_ = 0xf9;
  (**(code **)(*(long *)this + 200))(this,&local_1e0,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1e4);
  CEObserver::CEObserver(&local_170);
  CESkyCoord::ConvertToICRS(&local_1a0,&this->base_ecl_,date,&local_170);
  CEObserver::~CEObserver(&local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",&local_1e5);
  local_1e4 = 0xfd;
  (**(code **)(*(long *)this + 200))(this,&local_1a0,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1e5);
  CESkyCoord::Ecliptic2ICRS(&this->base_ecl_,&local_1a0,date);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_Convert2Icrs",&local_1e5);
  local_1e4 = 0x100;
  (**(code **)(*(long *)this + 200))(this,&local_1a0,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1e5);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CESkyCoord::~CESkyCoord(&local_1a0);
  CESkyCoord::~CESkyCoord((CESkyCoord *)&local_1e0);
  CESkyCoord::~CESkyCoord(&local_90);
  CESkyCoord::~CESkyCoord(&local_c0);
  CESkyCoord::~CESkyCoord(&local_60);
  return (bool)uVar1;
}

Assistant:

bool test_CESkyCoord::test_Convert2Icrs()
{
    // CIRS -> ICRS
    CESkyCoord cirs2icrs = base_cirs_.ConvertToICRS(base_date_);
    test_coords(cirs2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::CIRS2ICRS(base_cirs_, &cirs2icrs, base_date_);
    test_coords(cirs2icrs, base_icrs_, __func__, __LINE__);
    
    // ICRS -> ICRS
    CESkyCoord icrs2icrs = base_icrs_.ConvertToICRS();
    test_coords(icrs2icrs, base_icrs_, __func__, __LINE__);

    // Galactic -> ICRS
    CESkyCoord gal2icrs = base_gal_.ConvertToICRS();
    test_coords(gal2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Galactic2ICRS(base_gal_, &gal2icrs);
    test_coords(gal2icrs, base_icrs_, __func__, __LINE__);

    // Observed -> ICRS
    CESkyCoord obs2icrs = base_obs_.ConvertToICRS(base_date_, base_observer_);
    test_coords(obs2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Observed2ICRS(base_obs_, &obs2icrs, base_date_, base_observer_);
    test_coords(obs2icrs, base_icrs_, __func__, __LINE__);

    // Ecliptic -> ICRS
    CESkyCoord ecl2icrs = base_ecl_.ConvertToICRS(base_date_);
    test_coords(ecl2icrs, base_icrs_, __func__, __LINE__);

    CESkyCoord::Ecliptic2ICRS(base_ecl_, &ecl2icrs, base_date_);
    test_coords(ecl2icrs, base_icrs_, __func__, __LINE__);

    return pass();
}